

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseDataModuleField(WastParser *this,Module *module)

{
  Var *this_00;
  bool bVar1;
  Result RVar2;
  tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_> tVar3;
  Enum EVar4;
  Location loc;
  string name;
  __uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_e0;
  Location local_d8;
  Token local_b8;
  Var local_78;
  
  RVar2 = Expect(this,Lpar);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  GetToken(&local_b8,this);
  local_d8.field_1.field_1.offset._1_7_ = local_b8.loc.field_1.field_1.offset._1_7_;
  local_d8.field_1.field2[0] = local_b8.loc.field_1.field2[0];
  local_d8.field_1._8_8_ = local_b8.loc.field_1._8_8_;
  local_d8.filename._M_len = local_b8.loc.filename._M_len;
  local_d8.filename._M_str = local_b8.loc.filename._M_str;
  RVar2 = Expect(this,Data);
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  local_b8.loc.filename._M_len = (size_t)&local_b8.loc.field_1;
  local_b8.loc.filename._M_str = (char *)0x0;
  local_b8.loc.field_1.field2[0] = 0;
  ParseBindVarOpt(this,(string *)&local_b8);
  tVar3.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
        )operator_new(0xe0);
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 8) =
       0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x10)
       = 0;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x18) =
       (undefined4)local_d8.filename._M_len;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x1c) =
       local_d8.filename._M_len._4_4_;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x20) =
       local_d8.filename._M_str._0_4_;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x24) =
       local_d8.filename._M_str._4_4_;
  *(int *)((long)tVar3.
                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x28)
       = local_d8.field_1.field_0.line;
  *(int *)((long)tVar3.
                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x2c)
       = local_d8.field_1.field_0.first_column;
  *(int *)((long)tVar3.
                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x30)
       = local_d8.field_1.field_0.last_column;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x34) =
       local_d8.field_1._12_4_;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x38) = 8;
  *(undefined ***)
   tVar3.
   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
       &PTR__DataSegmentModuleField_00199a08;
  *(undefined4 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x40) = 0;
  *(long **)((long)tVar3.
                   super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x48
            ) = (long *)((long)tVar3.
                               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                               _M_head_impl + 0x58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)tVar3.
                    super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                    .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl +
             0x48),local_b8.loc.filename._M_len,
             local_b8.loc.filename._M_str + local_b8.loc.filename._M_len);
  this_00 = (Var *)((long)tVar3.
                          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                          .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl
                   + 0x68);
  Var::Var(this_00);
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xd0)
       = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xd8)
       = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xc0)
       = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 200)
       = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xb0)
       = 0;
  *(long *)((long)tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0xb8)
       = 0;
  bVar1 = PeekMatchLpar(this,Memory);
  if (bVar1) {
    RVar2 = Expect(this,Lpar);
    if ((((RVar2.enum_ != Error) && (RVar2 = Expect(this,Memory), RVar2.enum_ != Error)) &&
        (RVar2 = ParseVar(this,this_00), RVar2.enum_ != Error)) &&
       (RVar2 = Expect(this,Rpar), RVar2.enum_ != Error)) {
LAB_001375a0:
      RVar2 = ParseOffsetExpr(this,(ExprList *)
                                   ((long)tVar3.
                                          super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                          .
                                          super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                          ._M_head_impl + 0xb0));
      if (RVar2.enum_ != Error) goto LAB_001375d6;
    }
  }
  else {
    Var::Var(&local_78,0,&local_d8);
    bVar1 = ParseVarOpt(this,this_00,&local_78);
    Var::~Var(&local_78);
    if (bVar1) goto LAB_001375a0;
    bVar1 = ParseOffsetExprOpt(this,(ExprList *)
                                    ((long)tVar3.
                                           super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                           .
                                           super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>
                                           ._M_head_impl + 0xb0));
    if (!bVar1) {
      if ((this->options_->features).bulk_memory_enabled_ == false) {
        Error(this,0x171f23);
        goto LAB_0013764c;
      }
      *(undefined4 *)
       ((long)tVar3.
              super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
              .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl + 0x40) = 1
      ;
    }
LAB_001375d6:
    ParseTextListOpt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)tVar3.
                                 super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                                 .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                                 _M_head_impl + 200));
    RVar2 = Expect(this,Rpar);
    if (RVar2.enum_ != Error) {
      local_e0._M_t.
      super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            )(tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
              )tVar3.
               super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
               .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                  *)&local_e0);
      if ((_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
           )local_e0._M_t.
            super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl !=
          (DataSegmentModuleField *)0x0) {
        (**(code **)(*(long *)local_e0._M_t.
                              super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                              .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>.
                              _M_head_impl + 8))();
      }
      local_e0._M_t.
      super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            )(_Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
              )0x0;
      EVar4 = Ok;
      goto LAB_0013765a;
    }
  }
LAB_0013764c:
  (**(code **)(*(long *)tVar3.
                        super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                        .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl +
              8))(tVar3.
                  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl);
  EVar4 = Error;
LAB_0013765a:
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename._M_len !=
      &local_b8.loc.field_1) {
    operator_delete((void *)local_b8.loc.filename._M_len,
                    CONCAT71(local_b8.loc.field_1.field_1.offset._1_7_,
                             local_b8.loc.field_1.field2[0]) + 1);
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseDataModuleField(Module* module) {
  WABT_TRACE(ParseDataModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Data);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = std::make_unique<DataSegmentModuleField>(loc, name);

  if (PeekMatchLpar(TokenType::Memory)) {
    EXPECT(Lpar);
    EXPECT(Memory);
    CHECK_RESULT(ParseVar(&field->data_segment.memory_var));
    EXPECT(Rpar);
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (ParseVarOpt(&field->data_segment.memory_var, Var(0, loc))) {
    CHECK_RESULT(ParseOffsetExpr(&field->data_segment.offset));
  } else if (!ParseOffsetExprOpt(&field->data_segment.offset)) {
    if (!options_->features.bulk_memory_enabled()) {
      Error(loc, "passive data segments are not allowed");
      return Result::Error;
    }

    field->data_segment.kind = SegmentKind::Passive;
  }

  ParseTextListOpt(&field->data_segment.data);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}